

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O2

void __thiscall
ValueHashTable<ExprHash,_Value_*>::And
          (ValueHashTable<ExprHash,_Value_*> *this,ValueHashTable<ExprHash,_Value_*> *this2)

{
  ExprHash EVar1;
  SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  Value *pVVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  Type *pTVar8;
  NodeBase *pNVar9;
  undefined1 local_70 [8];
  EditingIterator iter;
  undefined1 local_40 [8];
  Iterator iter2;
  
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pNVar9 = (NodeBase *)0x0;
  do {
    if ((NodeBase *)(ulong)this->tableSize <= pNVar9) {
      return;
    }
    iter2.list = this2->table + (long)pNVar9;
    iter.last = pNVar9;
    local_40 = (undefined1  [8])iter2.list;
    if (iter2.list ==
        (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) {
LAB_0046624c:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    pSVar2 = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
             ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0;
    if ((undefined1  [8])pSVar2 != local_40) {
      iter2.list = pSVar2;
    }
    local_70 = (undefined1  [8])(this->table + (long)pNVar9);
    iter.super_Iterator.current = (NodeBase *)0x0;
    iter.super_Iterator.list =
         (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_70;
    while( true ) {
      bVar5 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
              EditingIterator::Next((EditingIterator *)local_70);
      if (!bVar5) break;
      pTVar7 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
               ::Data((Iterator *)local_70);
      while (((iter2.list !=
               (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0 &&
              ((undefined1  [8])iter2.list != local_40)) &&
             (EVar1 = pTVar7->value,
             pTVar8 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                      Iterator::Data((Iterator *)local_40), (uint)EVar1 < (uint)pTVar8->value))) {
        if (iter2.list ==
            (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) goto LAB_0046624c;
          *puVar6 = 0;
        }
        pSVar2 = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                 ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                     0x0;
        if ((undefined1  [8])pSVar2 != local_40) {
          iter2.list = pSVar2;
        }
      }
      if (((iter2.list ==
            (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
          ((undefined1  [8])iter2.list == local_40)) ||
         ((EVar1 = pTVar7->value,
          pTVar8 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40), EVar1 != pTVar8->value ||
          (pVVar3 = pTVar7->element,
          pTVar8 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40), pVVar3 != pTVar8->element)))) {
        SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator
        ::RemoveCurrent((EditingIterator *)local_70,&this->alloc->super_ArenaAllocator);
        if (this->stats != (DictionaryStats *)0x0) {
          DictionaryStats::Remove(this->stats,false);
        }
      }
      else {
        EVar1 = pTVar7->value;
        pTVar8 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                 Iterator::Data((Iterator *)local_40);
        if ((EVar1 != pTVar8->value) ||
           (pVVar3 = pTVar7->element,
           pTVar7 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)local_40), pVVar3 != pTVar7->element)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobHashTable.h"
                             ,0x14a,
                             "(bucket.value == iter2.Data().value && bucket.element == iter2.Data().element)"
                             ,"Huh??");
          if (!bVar5) goto LAB_0046624c;
          *puVar6 = 0;
        }
        if (iter2.list ==
            (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) goto LAB_0046624c;
          *puVar6 = 0;
        }
        pSVar2 = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                 ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                     0x0;
        if ((undefined1  [8])pSVar2 != local_40) {
          iter2.list = pSVar2;
        }
      }
    }
    pNVar9 = (NodeBase *)((long)&(iter.last)->next + 1);
  } while( true );
}

Assistant:

void And(ValueHashTable *this2)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<HashBucket>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(HashBucket, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    iter2.Next();
                }

                if (!iter2.IsValid() || bucket.value != iter2.Data().value || bucket.element != iter2.Data().element)
                {
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(false);
#endif
                    continue;
                }
                else
                {
                    AssertMsg(bucket.value == iter2.Data().value && bucket.element == iter2.Data().element, "Huh??");
                }
                iter2.Next();
            } NEXT_SLISTBASE_ENTRY_EDITING;
        }
    }